

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

int Bmc_CexBitCount(Abc_Cex_t *p,int nInputs)

{
  int iVar1;
  int local_28;
  int Counter2;
  int Counter;
  int k;
  int nInputs_local;
  Abc_Cex_t *p_local;
  
  local_28 = 0;
  if (p == (Abc_Cex_t *)0x0) {
    printf("The counter example is NULL.\n");
    p_local._4_4_ = -1;
  }
  else {
    for (Counter2 = 0; Counter2 < p->nBits; Counter2 = Counter2 + 1) {
      Abc_InfoHasBit((uint *)(p + 1),Counter2);
      if ((Counter2 - p->nRegs) % p->nPis < nInputs) {
        iVar1 = Abc_InfoHasBit((uint *)(p + 1),Counter2);
        local_28 = iVar1 + local_28;
      }
    }
    p_local._4_4_ = local_28;
  }
  return p_local._4_4_;
}

Assistant:

int Bmc_CexBitCount( Abc_Cex_t * p, int nInputs )
{
    int k, Counter = 0, Counter2 = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return -1;
    }
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( (k - p->nRegs) % p->nPis < nInputs )
            Counter2 += Abc_InfoHasBit(p->pData, k);
    }
    return Counter2;
}